

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fixSelectCb(Walker *p,Select *pSelect)

{
  DbFixer *pDVar1;
  sqlite3 *db;
  SrcList *pSVar2;
  char *zName;
  ushort uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  With *pWVar7;
  ushort *puVar8;
  long lVar9;
  long lVar10;
  
  pDVar1 = (p->u).pFix;
  db = pDVar1->pParse->db;
  iVar4 = sqlite3FindDbName(db,pDVar1->zDb);
  pSVar2 = pSelect->pSrc;
  if (pSVar2 == (SrcList *)0x0) {
    return 0;
  }
  if (0 < pSVar2->nSrc) {
    puVar8 = (ushort *)&pSVar2->a[0].fg.field_0x1;
    lVar9 = 0;
    do {
      if ((pDVar1->bTemp == '\0') && (uVar3 = *puVar8, (uVar3 & 4) == 0)) {
        bVar6 = (byte)puVar8[1];
        if (((bVar6 & 1) == 0) && (zName = *(char **)((long)puVar8 + 0x27), zName != (char *)0x0)) {
          iVar5 = sqlite3FindDbName(db,zName);
          if (iVar4 != iVar5) {
            sqlite3ErrorMsg(pDVar1->pParse,"%s %T cannot reference objects in database %s",
                            pDVar1->zType,pDVar1->pName,zName);
            return 2;
          }
          sqlite3DbFreeNN(db,zName);
          uVar3 = *puVar8 | 0x400;
          *puVar8 = uVar3;
          bVar6 = (byte)puVar8[1] | 2;
          *(byte *)(puVar8 + 1) = bVar6;
        }
        *(Schema **)((long)puVar8 + 0x27) = pDVar1->pSchema;
        *puVar8 = uVar3 | 0x100;
        *(byte *)(puVar8 + 1) = bVar6 | 1;
      }
      if ((((*puVar8 & 0x800) == 0) && (*(Expr **)((long)puVar8 + 0x1f) != (Expr *)0x0)) &&
         (iVar5 = sqlite3WalkExprNN(&pDVar1->w,*(Expr **)((long)puVar8 + 0x1f)), iVar5 != 0)) {
        return 2;
      }
      lVar9 = lVar9 + 1;
      puVar8 = puVar8 + 0x24;
    } while (lVar9 < pSVar2->nSrc);
  }
  pWVar7 = pSelect->pWith;
  if (pWVar7 != (With *)0x0) {
    if (pWVar7->nCte < 1) {
      return 0;
    }
    lVar9 = 0x20;
    lVar10 = 0;
    do {
      iVar4 = sqlite3WalkSelect(p,*(Select **)((long)pWVar7->a + lVar9 + -0x10));
      if (iVar4 != 0) {
        return 2;
      }
      lVar10 = lVar10 + 1;
      pWVar7 = pSelect->pWith;
      lVar9 = lVar9 + 0x30;
    } while (lVar10 < pWVar7->nCte);
  }
  return 0;
}

Assistant:

static int fixSelectCb(Walker *p, Select *pSelect){
  DbFixer *pFix = p->u.pFix;
  int i;
  SrcItem *pItem;
  sqlite3 *db = pFix->pParse->db;
  int iDb = sqlite3FindDbName(db, pFix->zDb);
  SrcList *pList = pSelect->pSrc;

  if( NEVER(pList==0) ) return WRC_Continue;
  for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
    if( pFix->bTemp==0 && pItem->fg.isSubquery==0 ){
      if( pItem->fg.fixedSchema==0 && pItem->u4.zDatabase!=0 ){
        if( iDb!=sqlite3FindDbName(db, pItem->u4.zDatabase) ){
          sqlite3ErrorMsg(pFix->pParse,
              "%s %T cannot reference objects in database %s",
              pFix->zType, pFix->pName, pItem->u4.zDatabase);
          return WRC_Abort;
        }
        sqlite3DbFree(db, pItem->u4.zDatabase);
        pItem->fg.notCte = 1;
        pItem->fg.hadSchema = 1;
      }
      pItem->u4.pSchema = pFix->pSchema;
      pItem->fg.fromDDL = 1;
      pItem->fg.fixedSchema = 1;
    }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_TRIGGER)
    if( pList->a[i].fg.isUsing==0
     && sqlite3WalkExpr(&pFix->w, pList->a[i].u3.pOn)
    ){
      return WRC_Abort;
    }
#endif
  }
  if( pSelect->pWith ){
    for(i=0; i<pSelect->pWith->nCte; i++){
      if( sqlite3WalkSelect(p, pSelect->pWith->a[i].pSelect) ){
        return WRC_Abort;
      }
    }
  }
  return WRC_Continue;
}